

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  u8 *puVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  u16 uVar8;
  uint uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint unaff_EBP;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  u8 *local_78;
  u8 *local_50;
  
  puVar4 = pPage->aData;
  uVar16 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar13 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar3 = pPage->pBt->usableSize;
  if ((int)(uint)puVar4[uVar16 + 7] <= nMaxFrag) {
    uVar10 = *(ushort *)(puVar4 + uVar16 + 1) << 8 | *(ushort *)(puVar4 + uVar16 + 1) >> 8;
    iVar17 = 0;
    if (uVar10 != 0) {
      uVar11 = *(ushort *)(puVar4 + uVar10) << 8 | *(ushort *)(puVar4 + uVar10) >> 8;
      if ((uVar11 == 0) ||
         ((iVar17 = 0, puVar4[uVar11] == '\0' && (puVar4[(ulong)uVar11 + 1] == '\0')))) {
        uVar6 = *(ushort *)(puVar4 + uVar16 + 5) << 8 | *(ushort *)(puVar4 + uVar16 + 5) >> 8;
        uVar14 = (uint)uVar10;
        iVar17 = uVar14 - uVar6;
        if (uVar14 < uVar6 || iVar17 == 0) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfb74,
                      "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
          iVar17 = 1;
        }
        else {
          uVar7 = *(ushort *)(puVar4 + (ulong)uVar10 + 2) << 8 |
                  *(ushort *)(puVar4 + (ulong)uVar10 + 2) >> 8;
          local_78._0_4_ = (uint)uVar7;
          uVar15 = (uint)uVar11;
          if (uVar15 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = *(ushort *)(puVar4 + (ulong)uVar11 + 2) << 8 |
                     *(ushort *)(puVar4 + (ulong)uVar11 + 2) >> 8;
            uVar9 = (uint)uVar10 + (uint)uVar7;
            memmove(puVar4 + (uVar11 + uVar9),puVar4 + uVar9,(long)(int)(uVar15 - uVar9));
            local_78._0_4_ = (uint)uVar11;
            local_78._0_4_ = uVar7 + (uint)local_78;
          }
          unaff_EBP = uVar6 + (uint)local_78;
          memmove(puVar4 + unaff_EBP,puVar4 + uVar6,(long)iVar17);
          iVar17 = 5;
          if (uVar1 < uVar13) {
            puVar12 = (ushort *)(puVar4 + uVar1);
            do {
              uVar6 = *puVar12 << 8 | *puVar12 >> 8;
              uVar10 = (ushort)(uint)local_78;
              if ((uVar6 < uVar14) || (uVar10 = uVar11, uVar6 < uVar15)) {
                *puVar12 = (uVar6 + uVar10) * 0x100 | (ushort)(uVar6 + uVar10) >> 8;
              }
              puVar12 = puVar12 + 1;
            } while (puVar12 < puVar4 + uVar13);
          }
        }
      }
    }
    if (iVar17 == 5) goto LAB_0013a875;
    if (iVar17 != 0) {
      return 0xb;
    }
  }
  unaff_EBP = uVar3;
  if ((ulong)uVar2 != 0) {
    uVar18 = 0;
    local_50 = (u8 *)0x0;
    local_78 = puVar4;
    do {
      uVar10 = *(ushort *)(puVar4 + uVar18 * 2 + (ulong)uVar1) << 8 |
               *(ushort *)(puVar4 + uVar18 * 2 + (ulong)uVar1) >> 8;
      if ((uVar10 < uVar13) ||
         (uVar14 = (uint)uVar10, uVar14 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar10)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfb96,
                    "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
        bVar5 = true;
      }
      else {
        uVar8 = (*pPage->xCellSize)(pPage,local_78 + uVar14);
        uVar15 = unaff_EBP - uVar8;
        if (((int)uVar15 < (int)uVar13) || ((int)uVar3 < (int)((uint)uVar10 + (uint)uVar8))) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfb9c,
                      "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
          bVar5 = true;
          unaff_EBP = uVar15;
        }
        else {
          *(ushort *)(puVar4 + uVar18 * 2 + (ulong)uVar1) =
               (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
          if (local_50 == (u8 *)0x0) {
            if (uVar15 == uVar14) {
              bVar5 = false;
              local_50 = (u8 *)0x0;
              unaff_EBP = uVar15;
              goto LAB_0013a846;
            }
            local_78 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            uVar10 = *(ushort *)(puVar4 + uVar16 + 5) << 8 | *(ushort *)(puVar4 + uVar16 + 5) >> 8;
            memcpy(local_78 + uVar10,puVar4 + uVar10,(long)(int)(unaff_EBP - uVar10));
            local_50 = local_78;
          }
          memcpy(puVar4 + uVar15,local_78 + uVar14,(ulong)uVar8);
          bVar5 = false;
          unaff_EBP = uVar15;
        }
      }
LAB_0013a846:
      if (bVar5) {
        return 0xb;
      }
      uVar18 = uVar18 + 1;
    } while (uVar2 != uVar18);
  }
  puVar4[uVar16 + 7] = '\0';
LAB_0013a875:
  if ((uint)puVar4[uVar16 + 7] + (unaff_EBP - uVar13) == (uint)pPage->nFree) {
    *(ushort *)(puVar4 + uVar16 + 5) = (ushort)unaff_EBP << 8 | (ushort)unaff_EBP >> 8;
    (puVar4 + uVar16 + 1)[0] = '\0';
    (puVar4 + uVar16 + 1)[1] = '\0';
    iVar17 = 0;
    memset(puVar4 + uVar13,0,(long)(int)(unaff_EBP - uVar13));
  }
  else {
    iVar17 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfbb0,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
  }
  return iVar17;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);

      /* pageFindSlot() has already verified that free blocks are sorted
      ** in order of offset within the page, and that no block extends
      ** past the end of the page. Provided the two free slots do not 
      ** overlap, this guarantees that the memmove() calls below will not
      ** overwrite the usableSize byte buffer, even if the database page
      ** is corrupt.  */
      assert( iFree2==0 || iFree2>iFree );
      assert( iFree+get2byte(&data[iFree+2]) <= usableSize );
      assert( iFree2==0 || iFree2+get2byte(&data[iFree2+2]) <= usableSize );

      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          assert( iFree+sz<=iFree2 ); /* Verified by pageFindSlot() */
          sz2 = get2byte(&data[iFree2+2]);
          assert( iFree+sz+sz2+iFree2-(iFree+sz) <= usableSize );
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }
        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}